

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O1

int vkt::tessellation::referencePrimitiveCount
              (TessPrimitiveType primitiveType,SpacingMode spacingMode,bool usePointMode,
              float *innerLevels,float *outerLevels)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  float fVar9;
  int outer_2 [3];
  int iStack_5c;
  pointer local_58;
  int outer [3];
  int local_3c;
  int inner;
  int local_2c;
  
  if ((int)CONCAT71(in_register_00000011,usePointMode) == 0) {
    bVar8 = true;
    if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      uVar3 = 3;
    }
    else if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
      uVar3 = 2;
    }
    else if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
      uVar3 = 4;
    }
    else {
      bVar8 = false;
      uVar3 = 0;
    }
    if ((bVar8) && (uVar4 = (ulong)((int)uVar3 + (uint)((int)uVar3 == 0)), 0.0 < *outerLevels)) {
      uVar6 = 0;
      do {
        uVar7 = uVar4;
        if (uVar4 - 1 == uVar6) break;
        uVar7 = uVar6 + 1;
        lVar1 = uVar6 + 1;
        uVar6 = uVar7;
      } while (0.0 < outerLevels[lVar1]);
      bVar8 = uVar7 < uVar3;
    }
    iVar2 = 0;
    if (!bVar8) {
      if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
        fVar9 = 1.0;
        if (1.0 <= *outerLevels) {
          fVar9 = *outerLevels;
        }
        fVar9 = ceilf(fVar9);
        iVar2 = getClampedRoundedTessLevel(spacingMode,outerLevels[1]);
        iVar2 = iVar2 * (int)fVar9;
      }
      else if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
        getClampedRoundedQuadTessLevels(spacingMode,innerLevels,outerLevels,outer,outer_2);
        iVar2 = referenceQuadNonPointModePrimitiveCount
                          (spacingMode,outer[0],outer[1],outer_2[0],outer_2[1],outer_2[2],iStack_5c)
        ;
      }
      else if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        getClampedRoundedTriangleTessLevels(spacingMode,innerLevels,outerLevels,outer,outer_2);
        iVar2 = referenceTriangleNonPointModePrimitiveCount
                          (spacingMode,outer[0],outer_2[0],outer_2[1],outer_2[2]);
        return iVar2;
      }
    }
  }
  else {
    bVar8 = true;
    if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      uVar3 = 3;
    }
    else if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
      uVar3 = 2;
    }
    else if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
      uVar3 = 4;
    }
    else {
      bVar8 = false;
      uVar3 = 0;
    }
    if ((bVar8) && (uVar4 = (ulong)((int)uVar3 + (uint)((int)uVar3 == 0)), 0.0 < *outerLevels)) {
      uVar6 = 0;
      do {
        uVar7 = uVar4;
        if (uVar4 - 1 == uVar6) break;
        uVar7 = uVar6 + 1;
        lVar1 = uVar6 + 1;
        uVar6 = uVar7;
      } while (0.0 < outerLevels[lVar1]);
      bVar8 = uVar7 < uVar3;
    }
    iVar2 = 0;
    if (!bVar8) {
      if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
        fVar9 = 1.0;
        if (1.0 <= *outerLevels) {
          fVar9 = *outerLevels;
        }
        fVar9 = ceilf(fVar9);
        iVar2 = getClampedRoundedTessLevel(spacingMode,outerLevels[1]);
        generateReferenceIsolineTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)outer_2
                   ,(int)fVar9,iVar2);
        pvVar5 = (void *)CONCAT44(outer_2[1],outer_2[0]);
      }
      else {
        if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
          getClampedRoundedQuadTessLevels(spacingMode,innerLevels,outerLevels,&inner,outer);
          generateReferenceQuadTessCoords
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     outer_2,spacingMode,inner,local_2c,outer[0],outer[1],outer[2],local_3c);
        }
        else {
          if (primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
            return 0;
          }
          getClampedRoundedTriangleTessLevels(spacingMode,innerLevels,outerLevels,&inner,outer);
          generateReferenceTriangleTessCoords
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     outer_2,spacingMode,inner,outer[0],outer[1],outer[2]);
        }
        pvVar5 = (void *)CONCAT44(outer_2[1],outer_2[0]);
      }
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)local_58 - (long)pvVar5);
      }
      iVar2 = (int)((ulong)(CONCAT44(iStack_5c,outer_2[2]) - (long)pvVar5) >> 2) * -0x55555555;
    }
  }
  return iVar2;
}

Assistant:

int referencePrimitiveCount (const TessPrimitiveType primitiveType, const SpacingMode spacingMode, const bool usePointMode, const float* innerLevels, const float* outerLevels)
{
	return usePointMode ? referencePointModePrimitiveCount		(primitiveType, spacingMode, innerLevels, outerLevels)
						: referenceNonPointModePrimitiveCount	(primitiveType, spacingMode, innerLevels, outerLevels);
}